

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cFramebufferNoAttachmentsTests.cpp
# Opt level: O1

void __thiscall
glcts::FramebufferNoAttachmentsBaseCase::expect_fbo_status
          (FramebufferNoAttachmentsBaseCase *this,GLenum target,GLenum expected_status,
          char *fail_message)

{
  int iVar1;
  deUint32 dVar2;
  GLenum GVar3;
  undefined4 extraout_var;
  size_t sVar5;
  TestError *this_00;
  ostringstream msgStr;
  undefined1 local_1a8 [376];
  long lVar4;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  if (dVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Error before glCheckFramebufferStatus() for \'",0x2d);
    if (fail_message == (char *)0x0) {
      std::ios::clear((int)local_1a8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar5 = strlen(fail_message);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,fail_message,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\'\n",2);
    glu::checkError(dVar2,"Error before glCheckFramebufferStatus()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cFramebufferNoAttachmentsTests.cpp"
                    ,0x7b);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  GVar3 = (**(code **)(lVar4 + 0x170))(target);
  if (GVar3 == expected_status) {
    dVar2 = (**(code **)(lVar4 + 0x800))();
    if (dVar2 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Error after glCheckFramebufferStatus() for \'",0x2c);
      if (fail_message == (char *)0x0) {
        std::ios::clear((int)local_1a8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar5 = strlen(fail_message);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,fail_message,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\'\n",2);
      glu::checkError(dVar2,"Error after glCheckFramebufferStatus()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cFramebufferNoAttachmentsTests.cpp"
                      ,0x86);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    }
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,fail_message,"gl.checkFramebufferStatus(target) == expected_status",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cFramebufferNoAttachmentsTests.cpp"
             ,0x7e);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void FramebufferNoAttachmentsBaseCase::expect_fbo_status(GLenum target, GLenum expected_status,
														 const char* fail_message)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();
	GLenum				  error;

	error = gl.getError();
	if (error != GL_NO_ERROR)
	{
		std::ostringstream msgStr;
		msgStr << "Error before glCheckFramebufferStatus() for '" << fail_message << "'\n";

		GLU_EXPECT_NO_ERROR(error, "Error before glCheckFramebufferStatus()");
	}

	TCU_CHECK_MSG(gl.checkFramebufferStatus(target) == expected_status, fail_message);

	error = gl.getError();
	if (error != GL_NO_ERROR)
	{
		std::ostringstream msgStr;
		msgStr << "Error after glCheckFramebufferStatus() for '" << fail_message << "'\n";

		GLU_EXPECT_NO_ERROR(error, "Error after glCheckFramebufferStatus()");
	}
}